

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

parameters __thiscall cpp_db::statement::get_parameters(statement *this)

{
  int iVar1;
  element_type *peVar2;
  int iVar3;
  runtime_error *this_00;
  weak_ptr<cpp_db::driver_interface> *in_RSI;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar5;
  element_type *local_40 [2];
  element_type local_30 [2];
  
  iVar3 = (*(in_RSI[1].super___weak_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->_vptr_driver_interface[3])();
  if ((char)iVar3 == '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Statement not prepared!","")
    ;
    std::runtime_error::runtime_error(this_00,(string *)local_40);
    *(undefined ***)this_00 = &PTR__runtime_error_00199840;
    __cxa_throw(this_00,&db_exception::typeinfo,std::runtime_error::~runtime_error);
  }
  parameters::parameters((parameters *)this);
  tools::do_check<cpp_db::driver_interface>(in_RSI,"Invalid database driver");
  this_01 = (in_RSI->super___weak_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = this_01->_M_use_count;
    do {
      if (iVar3 == 0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_01->_M_use_count;
      bVar5 = iVar3 == iVar1;
      if (bVar5) {
        this_01->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar5);
  }
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar5 = true;
  }
  else {
    bVar5 = this_01->_M_use_count == 0;
  }
  if (bVar5) {
    peVar4 = (element_type *)0x0;
  }
  else {
    peVar4 = (in_RSI->super___weak_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
  }
  (*peVar4->_vptr_driver_interface[4])(local_40,peVar4,in_RSI + 1);
  peVar2 = local_40[0];
  local_40[0] = (element_type *)0x0;
  peVar4 = (this->driver_impl).
           super___weak_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->driver_impl).super___weak_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar2;
  if (peVar4 != (element_type *)0x0) {
    (*peVar4->_vptr_driver_interface[1])();
  }
  if (local_40[0] != (element_type *)0x0) {
    (*local_40[0]->_vptr_driver_interface[1])();
  }
  local_40[0] = (element_type *)0x0;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return (unique_ptr<cpp_db::parameters_interface,_std::default_delete<cpp_db::parameters_interface>_>
          )(unique_ptr<cpp_db::parameters_interface,_std::default_delete<cpp_db::parameters_interface>_>
            )this;
}

Assistant:

parameters statement::get_parameters() const
{
	if (!is_prepared())
		throw db_exception("Statement not prepared!");

    parameters params;
    params.params_impl = tools::lock_or_throw(driver_impl, "Invalid database driver")->make_parameters(stmt_impl);
    return params;
}